

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 (*pauVar16) [16];
  int iVar17;
  undefined4 uVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  long lVar20;
  RayHitK<4> *pRVar22;
  long lVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float *vertices;
  ulong uVar33;
  Scene *pSVar34;
  size_t sVar35;
  ulong uVar36;
  size_t sVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  float fVar99;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar152;
  undefined1 auVar148 [16];
  float fVar150;
  float fVar151;
  undefined1 auVar149 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RayHitK<4> local_2801;
  ulong local_2800;
  undefined1 (*local_27f8) [16];
  ulong local_27f0;
  ulong local_27e8;
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [16];
  undefined1 local_2790 [16];
  Scene *local_2778;
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 *local_2730;
  ulong local_2728;
  ulong local_2720;
  ulong local_2718;
  ulong local_2710;
  size_t local_2708;
  size_t local_2700;
  RayHitK<4> *local_26f8;
  long local_26f0;
  long local_26e8;
  undefined8 *local_26e0;
  void *local_26d8;
  RTCRayQueryContext *local_26d0;
  RayHitK<4> *local_26c8;
  undefined1 (*local_26c0) [16];
  undefined4 local_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [16];
  RayHitK<4> *local_2670;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [2] [16];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  uint local_24f0;
  uint uStack_24ec;
  uint uStack_24e8;
  uint uStack_24e4;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar21;
  
  local_27f8 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar18 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar18;
  local_23c0._0_4_ = uVar18;
  local_23c0._8_4_ = uVar18;
  local_23c0._12_4_ = uVar18;
  local_23c0._16_4_ = uVar18;
  local_23c0._20_4_ = uVar18;
  local_23c0._24_4_ = uVar18;
  local_23c0._28_4_ = uVar18;
  auVar87 = ZEXT3264(local_23c0);
  uVar18 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar18;
  local_23e0._0_4_ = uVar18;
  local_23e0._8_4_ = uVar18;
  local_23e0._12_4_ = uVar18;
  local_23e0._16_4_ = uVar18;
  local_23e0._20_4_ = uVar18;
  local_23e0._24_4_ = uVar18;
  local_23e0._28_4_ = uVar18;
  auVar96 = ZEXT3264(local_23e0);
  uVar18 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar18;
  local_2400._0_4_ = uVar18;
  local_2400._8_4_ = uVar18;
  local_2400._12_4_ = uVar18;
  local_2400._16_4_ = uVar18;
  local_2400._20_4_ = uVar18;
  local_2400._24_4_ = uVar18;
  local_2400._28_4_ = uVar18;
  auVar98 = ZEXT3264(local_2400);
  local_2480 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_24a0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_24c0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2420 = local_2480 * 0.99999964;
  local_2440 = local_24a0 * 0.99999964;
  local_2460 = local_24c0 * 0.99999964;
  local_2480 = local_2480 * 1.0000004;
  local_24a0 = local_24a0 * 1.0000004;
  local_24c0 = local_24c0 * 1.0000004;
  local_2710 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2718 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2720 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2728 = local_2710 ^ 0x20;
  local_27e8 = local_2718 ^ 0x20;
  local_27f0 = local_2720 ^ 0x20;
  iVar17 = (tray->tnear).field_0.i[k];
  local_25e0._4_4_ = iVar17;
  local_25e0._0_4_ = iVar17;
  local_25e0._8_4_ = iVar17;
  local_25e0._12_4_ = iVar17;
  local_25e0._16_4_ = iVar17;
  local_25e0._20_4_ = iVar17;
  local_25e0._24_4_ = iVar17;
  local_25e0._28_4_ = iVar17;
  auVar149 = ZEXT3264(local_25e0);
  iVar17 = (tray->tfar).field_0.i[k];
  auVar46 = ZEXT3264(CONCAT428(iVar17,CONCAT424(iVar17,CONCAT420(iVar17,CONCAT416(iVar17,CONCAT412(
                                                  iVar17,CONCAT48(iVar17,CONCAT44(iVar17,iVar17)))))
                                               )));
  local_2730 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  fStack_241c = local_2420;
  fStack_2418 = local_2420;
  fStack_2414 = local_2420;
  fStack_2410 = local_2420;
  fStack_240c = local_2420;
  fStack_2408 = local_2420;
  fStack_2404 = local_2420;
  fStack_243c = local_2440;
  fStack_2438 = local_2440;
  fStack_2434 = local_2440;
  fStack_2430 = local_2440;
  fStack_242c = local_2440;
  fStack_2428 = local_2440;
  fStack_2424 = local_2440;
  fStack_245c = local_2460;
  fStack_2458 = local_2460;
  fStack_2454 = local_2460;
  fStack_2450 = local_2460;
  fStack_244c = local_2460;
  fStack_2448 = local_2460;
  fStack_2444 = local_2460;
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  fStack_249c = local_24a0;
  fStack_2498 = local_24a0;
  fStack_2494 = local_24a0;
  fStack_2490 = local_24a0;
  fStack_248c = local_24a0;
  fStack_2488 = local_24a0;
  fStack_2484 = local_24a0;
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  uVar21 = local_27e8;
  uVar24 = local_27f0;
  uVar28 = local_2710;
  uVar29 = local_2718;
  uVar30 = local_2728;
  sVar37 = k;
  uVar31 = local_2720;
  fVar99 = local_2420;
  fVar105 = local_2420;
  fVar106 = local_2420;
  fVar107 = local_2420;
  fVar108 = local_2420;
  fVar109 = local_2420;
  fVar110 = local_2420;
  fVar111 = local_2440;
  fVar113 = local_2440;
  fVar114 = local_2440;
  fVar115 = local_2440;
  fVar116 = local_2440;
  fVar117 = local_2440;
  fVar147 = local_2440;
  fVar150 = local_2460;
  fVar151 = local_2460;
  fVar152 = local_2460;
  fVar118 = local_2460;
  fVar119 = local_2460;
  fVar120 = local_2460;
  fVar121 = local_2460;
  fVar122 = local_2480;
  fVar124 = local_2480;
  fVar125 = local_2480;
  fVar126 = local_2480;
  fVar127 = local_2480;
  fVar128 = local_2480;
  fVar129 = local_2480;
  fVar130 = local_24a0;
  fVar133 = local_24a0;
  fVar134 = local_24a0;
  fVar135 = local_24a0;
  fVar136 = local_24a0;
  fVar137 = local_24a0;
  fVar138 = local_24a0;
  fVar139 = local_24c0;
  fVar141 = local_24c0;
  fVar142 = local_24c0;
  fVar143 = local_24c0;
  fVar144 = local_24c0;
  fVar145 = local_24c0;
  fVar146 = local_24c0;
  local_2700 = k;
  local_26f8 = ray;
  do {
    do {
      do {
        if (local_27f8 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar16 = local_27f8 + -1;
        local_27f8 = local_27f8 + -1;
      } while (*(float *)(ray + sVar37 * 4 + 0x80) < *(float *)(*pauVar16 + 8));
      uVar27 = *(ulong *)*local_27f8;
      do {
        auVar97 = auVar98._0_32_;
        auVar95 = auVar96._0_32_;
        auVar86 = auVar87._0_32_;
        if ((uVar27 & 8) == 0) {
          uVar19 = uVar27 & 0xfffffffffffffff0;
          uVar18 = *(undefined4 *)(ray + sVar37 * 4 + 0x70);
          auVar57._4_4_ = uVar18;
          auVar57._0_4_ = uVar18;
          auVar57._8_4_ = uVar18;
          auVar57._12_4_ = uVar18;
          auVar57._16_4_ = uVar18;
          auVar57._20_4_ = uVar18;
          auVar57._24_4_ = uVar18;
          auVar57._28_4_ = uVar18;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar28),auVar57,
                                    *(undefined1 (*) [32])(uVar19 + 0x40 + uVar28));
          auVar7 = vsubps_avx(ZEXT1632(auVar47),auVar86);
          auVar8._4_4_ = fVar105 * auVar7._4_4_;
          auVar8._0_4_ = fVar99 * auVar7._0_4_;
          auVar8._8_4_ = fVar106 * auVar7._8_4_;
          auVar8._12_4_ = fVar107 * auVar7._12_4_;
          auVar8._16_4_ = fVar108 * auVar7._16_4_;
          auVar8._20_4_ = fVar109 * auVar7._20_4_;
          auVar8._24_4_ = fVar110 * auVar7._24_4_;
          auVar8._28_4_ = auVar7._28_4_;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar29),auVar57,
                                    *(undefined1 (*) [32])(uVar19 + 0x40 + uVar29));
          auVar7 = vmaxps_avx(auVar149._0_32_,auVar8);
          auVar8 = vsubps_avx(ZEXT1632(auVar47),auVar95);
          auVar6._4_4_ = fVar113 * auVar8._4_4_;
          auVar6._0_4_ = fVar111 * auVar8._0_4_;
          auVar6._8_4_ = fVar114 * auVar8._8_4_;
          auVar6._12_4_ = fVar115 * auVar8._12_4_;
          auVar6._16_4_ = fVar116 * auVar8._16_4_;
          auVar6._20_4_ = fVar117 * auVar8._20_4_;
          auVar6._24_4_ = fVar147 * auVar8._24_4_;
          auVar6._28_4_ = auVar8._28_4_;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar31),auVar57,
                                    *(undefined1 (*) [32])(uVar19 + 0x40 + uVar31));
          auVar8 = vsubps_avx(ZEXT1632(auVar47),auVar97);
          auVar10._4_4_ = fVar151 * auVar8._4_4_;
          auVar10._0_4_ = fVar150 * auVar8._0_4_;
          auVar10._8_4_ = fVar152 * auVar8._8_4_;
          auVar10._12_4_ = fVar118 * auVar8._12_4_;
          auVar10._16_4_ = fVar119 * auVar8._16_4_;
          auVar10._20_4_ = fVar120 * auVar8._20_4_;
          auVar10._24_4_ = fVar121 * auVar8._24_4_;
          auVar10._28_4_ = auVar8._28_4_;
          auVar8 = vmaxps_avx(auVar6,auVar10);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar30),auVar57,
                                    *(undefined1 (*) [32])(uVar19 + 0x40 + uVar30));
          local_26a0 = vmaxps_avx(auVar7,auVar8);
          auVar7 = vsubps_avx(ZEXT1632(auVar47),auVar86);
          auVar11._4_4_ = fVar124 * auVar7._4_4_;
          auVar11._0_4_ = fVar122 * auVar7._0_4_;
          auVar11._8_4_ = fVar125 * auVar7._8_4_;
          auVar11._12_4_ = fVar126 * auVar7._12_4_;
          auVar11._16_4_ = fVar127 * auVar7._16_4_;
          auVar11._20_4_ = fVar128 * auVar7._20_4_;
          auVar11._24_4_ = fVar129 * auVar7._24_4_;
          auVar11._28_4_ = auVar7._28_4_;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar21),auVar57,
                                    *(undefined1 (*) [32])(uVar19 + 0x40 + uVar21));
          auVar7 = vsubps_avx(ZEXT1632(auVar47),auVar95);
          auVar12._4_4_ = fVar133 * auVar7._4_4_;
          auVar12._0_4_ = fVar130 * auVar7._0_4_;
          auVar12._8_4_ = fVar134 * auVar7._8_4_;
          auVar12._12_4_ = fVar135 * auVar7._12_4_;
          auVar12._16_4_ = fVar136 * auVar7._16_4_;
          auVar12._20_4_ = fVar137 * auVar7._20_4_;
          auVar12._24_4_ = fVar138 * auVar7._24_4_;
          auVar12._28_4_ = auVar7._28_4_;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar24),auVar57,
                                    *(undefined1 (*) [32])(uVar19 + 0x40 + uVar24));
          auVar7 = vsubps_avx(ZEXT1632(auVar47),auVar97);
          auVar13._4_4_ = fVar141 * auVar7._4_4_;
          auVar13._0_4_ = fVar139 * auVar7._0_4_;
          auVar13._8_4_ = fVar142 * auVar7._8_4_;
          auVar13._12_4_ = fVar143 * auVar7._12_4_;
          auVar13._16_4_ = fVar144 * auVar7._16_4_;
          auVar13._20_4_ = fVar145 * auVar7._20_4_;
          auVar13._24_4_ = fVar146 * auVar7._24_4_;
          auVar13._28_4_ = auVar7._28_4_;
          auVar7 = vminps_avx(auVar12,auVar13);
          auVar8 = vminps_avx(auVar46._0_32_,auVar11);
          auVar7 = vminps_avx(auVar8,auVar7);
          auVar7 = vcmpps_avx(local_26a0,auVar7,2);
          if (((uint)uVar27 & 7) == 6) {
            auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x1c0),auVar57,2);
            auVar6 = vcmpps_avx(auVar57,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
            auVar8 = vandps_avx(auVar8,auVar6);
            auVar7 = vandps_avx(auVar8,auVar7);
            auVar47 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
          }
          else {
            auVar47 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
          }
          auVar47 = vpsllw_avx(auVar47,0xf);
          auVar47 = vpacksswb_avx(auVar47,auVar47);
          k = (size_t)(byte)(SUB161(auVar47 >> 7,0) & 1 | (SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar47 >> 0x37,0) & 1) << 6 | SUB161(auVar47 >> 0x3f,0) << 7);
        }
        if ((uVar27 & 8) == 0) {
          if (k == 0) {
            iVar17 = 4;
          }
          else {
            uVar19 = uVar27 & 0xfffffffffffffff0;
            lVar9 = 0;
            for (uVar27 = k; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar9 = lVar9 + 1;
            }
            iVar17 = 0;
            uVar33 = k - 1 & k;
            uVar27 = *(ulong *)(uVar19 + lVar9 * 8);
            if (uVar33 != 0) {
              uVar3 = *(uint *)(local_26a0 + lVar9 * 4);
              lVar9 = 0;
              for (uVar21 = uVar33; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                lVar9 = lVar9 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar32 = *(ulong *)(uVar19 + lVar9 * 8);
              uVar4 = *(uint *)(local_26a0 + lVar9 * 4);
              uVar21 = local_27e8;
              uVar24 = local_27f0;
              if (uVar33 == 0) {
                if (uVar3 < uVar4) {
                  *(ulong *)*local_27f8 = uVar32;
                  *(uint *)(*local_27f8 + 8) = uVar4;
                  local_27f8 = local_27f8 + 1;
                }
                else {
                  *(ulong *)*local_27f8 = uVar27;
                  *(uint *)(*local_27f8 + 8) = uVar3;
                  uVar27 = uVar32;
                  local_27f8 = local_27f8 + 1;
                }
              }
              else {
                auVar47._8_8_ = 0;
                auVar47._0_8_ = uVar27;
                auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar3));
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar32;
                auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar4));
                lVar9 = 0;
                for (uVar27 = uVar33; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
                {
                  lVar9 = lVar9 + 1;
                }
                uVar33 = uVar33 - 1 & uVar33;
                auVar62._8_8_ = 0;
                auVar62._0_8_ = *(ulong *)(uVar19 + lVar9 * 8);
                auVar48 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_26a0 + lVar9 * 4)));
                auVar62 = vpcmpgtd_avx(auVar58,auVar47);
                if (uVar33 == 0) {
                  auVar73 = vpshufd_avx(auVar62,0xaa);
                  auVar62 = vblendvps_avx(auVar58,auVar47,auVar73);
                  auVar47 = vblendvps_avx(auVar47,auVar58,auVar73);
                  auVar58 = vpcmpgtd_avx(auVar48,auVar62);
                  auVar73 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar48,auVar62,auVar73);
                  auVar62 = vblendvps_avx(auVar62,auVar48,auVar73);
                  auVar48 = vpcmpgtd_avx(auVar62,auVar47);
                  auVar73 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar62,auVar47,auVar73);
                  auVar47 = vblendvps_avx(auVar47,auVar62,auVar73);
                  *local_27f8 = auVar47;
                  local_27f8[1] = auVar48;
                  uVar27 = auVar58._0_8_;
                  local_27f8 = local_27f8 + 2;
                }
                else {
                  lVar9 = 0;
                  for (uVar27 = uVar33; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000
                      ) {
                    lVar9 = lVar9 + 1;
                  }
                  uVar33 = uVar33 - 1 & uVar33;
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = *(ulong *)(uVar19 + lVar9 * 8);
                  auVar73 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_26a0 + lVar9 * 4)));
                  if (uVar33 == 0) {
                    auVar51 = vpshufd_avx(auVar62,0xaa);
                    auVar62 = vblendvps_avx(auVar58,auVar47,auVar51);
                    auVar47 = vblendvps_avx(auVar47,auVar58,auVar51);
                    auVar58 = vpcmpgtd_avx(auVar73,auVar48);
                    auVar51 = vpshufd_avx(auVar58,0xaa);
                    auVar58 = vblendvps_avx(auVar73,auVar48,auVar51);
                    auVar48 = vblendvps_avx(auVar48,auVar73,auVar51);
                    auVar73 = vpcmpgtd_avx(auVar48,auVar47);
                    auVar51 = vpshufd_avx(auVar73,0xaa);
                    auVar73 = vblendvps_avx(auVar48,auVar47,auVar51);
                    auVar47 = vblendvps_avx(auVar47,auVar48,auVar51);
                    auVar48 = vpcmpgtd_avx(auVar58,auVar62);
                    auVar51 = vpshufd_avx(auVar48,0xaa);
                    auVar48 = vblendvps_avx(auVar58,auVar62,auVar51);
                    auVar58 = vblendvps_avx(auVar62,auVar58,auVar51);
                    auVar62 = vpcmpgtd_avx(auVar73,auVar58);
                    auVar51 = vpshufd_avx(auVar62,0xaa);
                    auVar62 = vblendvps_avx(auVar73,auVar58,auVar51);
                    auVar58 = vblendvps_avx(auVar58,auVar73,auVar51);
                    *local_27f8 = auVar47;
                    local_27f8[1] = auVar58;
                    local_27f8[2] = auVar62;
                    uVar27 = auVar48._0_8_;
                    local_27f8 = local_27f8 + 3;
                  }
                  else {
                    *local_27f8 = auVar47;
                    local_27f8[1] = auVar58;
                    local_27f8[2] = auVar48;
                    local_27f8[3] = auVar73;
                    lVar9 = 0x30;
                    do {
                      lVar23 = lVar9;
                      lVar9 = 0;
                      for (uVar27 = uVar33; (uVar27 & 1) == 0;
                          uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                        lVar9 = lVar9 + 1;
                      }
                      auVar48._8_8_ = 0;
                      auVar48._0_8_ = *(ulong *)(uVar19 + lVar9 * 8);
                      auVar47 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_26a0 + lVar9 * 4)));
                      *(undefined1 (*) [16])(local_27f8[1] + lVar23) = auVar47;
                      uVar33 = uVar33 - 1 & uVar33;
                      lVar9 = lVar23 + 0x10;
                    } while (uVar33 != 0);
                    pauVar16 = (undefined1 (*) [16])(local_27f8[1] + lVar23);
                    if (lVar23 + 0x10 != 0) {
                      local_2800 = 0x10;
                      pauVar25 = local_27f8;
                      do {
                        auVar47 = pauVar25[1];
                        uVar3 = *(uint *)(pauVar25[1] + 8);
                        pauVar25 = pauVar25 + 1;
                        uVar27 = local_2800;
                        do {
                          if (uVar3 <= *(uint *)(local_27f8[-1] + uVar27 + 8)) {
                            pauVar26 = (undefined1 (*) [16])(*local_27f8 + uVar27);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_27f8 + uVar27) =
                               *(undefined1 (*) [16])(local_27f8[-1] + uVar27);
                          uVar27 = uVar27 + -0x10;
                          pauVar26 = local_27f8;
                        } while (uVar27 != 0);
                        *pauVar26 = auVar47;
                        local_2800 = local_2800 + 0x10;
                      } while (pauVar16 != pauVar25);
                    }
                    uVar27 = *(ulong *)*pauVar16;
                    local_27f8 = pauVar16;
                  }
                  auVar87 = ZEXT3264(auVar86);
                  auVar96 = ZEXT3264(auVar95);
                  auVar98 = ZEXT3264(auVar97);
                  auVar149 = ZEXT3264(local_25e0);
                }
              }
            }
          }
        }
        else {
          iVar17 = 6;
        }
      } while (iVar17 == 0);
    } while (iVar17 != 6);
    local_26f0 = (ulong)((uint)uVar27 & 0xf) - 8;
    local_2708 = k;
    if (local_26f0 != 0) {
      uVar27 = uVar27 & 0xfffffffffffffff0;
      local_26e8 = 0;
      pRVar22 = ray;
      sVar35 = sVar37;
      local_2800 = uVar27;
      do {
        ray = local_26f8;
        sVar37 = local_2700;
        lVar20 = local_26e8 * 0x50;
        pSVar34 = context->scene;
        pGVar5 = (pSVar34->geometries).items[*(uint *)(uVar27 + 0x30 + lVar20)].ptr;
        fVar99 = (pGVar5->time_range).lower;
        fVar99 = pGVar5->fnumTimeSegments *
                 ((*(float *)(pRVar22 + sVar35 * 4 + 0x70) - fVar99) /
                 ((pGVar5->time_range).upper - fVar99));
        auVar47 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),9);
        auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
        auVar59 = vmaxss_avx(ZEXT816(0),auVar47);
        lVar23 = (long)(int)auVar59._0_4_ * 0x38;
        uVar38 = (ulong)*(uint *)(uVar27 + 4 + lVar20);
        lVar9 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar23);
        lVar23 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar23);
        auVar47 = *(undefined1 (*) [16])(lVar9 + (ulong)*(uint *)(uVar27 + lVar20) * 4);
        uVar21 = (ulong)*(uint *)(uVar27 + 0x10 + lVar20);
        auVar58 = *(undefined1 (*) [16])(lVar9 + uVar21 * 4);
        uVar28 = (ulong)*(uint *)(uVar27 + 0x20 + lVar20);
        auVar65 = *(undefined1 (*) [16])(lVar9 + uVar28 * 4);
        auVar62 = *(undefined1 (*) [16])(lVar9 + uVar38 * 4);
        uVar29 = (ulong)*(uint *)(local_2800 + 0x14 + lVar20);
        auVar48 = *(undefined1 (*) [16])(lVar9 + uVar29 * 4);
        uVar30 = (ulong)*(uint *)(local_2800 + 0x24 + lVar20);
        auVar67 = *(undefined1 (*) [16])(lVar9 + uVar30 * 4);
        uVar36 = (ulong)*(uint *)(local_2800 + 8 + lVar20);
        auVar73 = *(undefined1 (*) [16])(lVar9 + uVar36 * 4);
        uVar33 = (ulong)*(uint *)(local_2800 + 0x18 + lVar20);
        auVar51 = *(undefined1 (*) [16])(lVar9 + uVar33 * 4);
        uVar31 = (ulong)*(uint *)(local_2800 + 0x28 + lVar20);
        auVar49 = *(undefined1 (*) [16])(lVar9 + uVar31 * 4);
        uVar24 = (ulong)*(uint *)(local_2800 + 0xc + lVar20);
        auVar42 = *(undefined1 (*) [16])(lVar9 + uVar24 * 4);
        uVar32 = (ulong)*(uint *)(local_2800 + 0x1c + lVar20);
        auVar40 = *(undefined1 (*) [16])(lVar9 + uVar32 * 4);
        uVar19 = (ulong)*(uint *)(local_2800 + 0x2c + lVar20);
        auVar39 = *(undefined1 (*) [16])(lVar9 + uVar19 * 4);
        auVar41 = *(undefined1 (*) [16])(lVar23 + (ulong)*(uint *)(uVar27 + lVar20) * 4);
        auVar50 = *(undefined1 (*) [16])(lVar23 + uVar21 * 4);
        fVar99 = fVar99 - auVar59._0_4_;
        auVar59 = vunpcklps_avx(auVar47,auVar73);
        auVar73 = vunpckhps_avx(auVar47,auVar73);
        auVar60 = vunpcklps_avx(auVar62,auVar42);
        auVar62 = vunpckhps_avx(auVar62,auVar42);
        auVar47 = *(undefined1 (*) [16])(lVar23 + uVar38 * 4);
        auVar63 = vunpcklps_avx(auVar73,auVar62);
        auVar64 = vunpcklps_avx(auVar59,auVar60);
        auVar73 = vunpckhps_avx(auVar59,auVar60);
        auVar42 = vunpcklps_avx(auVar58,auVar51);
        auVar62 = vunpckhps_avx(auVar58,auVar51);
        auVar51 = vunpcklps_avx(auVar48,auVar40);
        auVar48 = vunpckhps_avx(auVar48,auVar40);
        auVar58 = *(undefined1 (*) [16])(lVar23 + uVar36 * 4);
        auVar40 = vunpcklps_avx(auVar62,auVar48);
        auVar59 = vunpcklps_avx(auVar42,auVar51);
        auVar48 = vunpckhps_avx(auVar42,auVar51);
        auVar42 = vunpcklps_avx(auVar65,auVar49);
        auVar51 = vunpckhps_avx(auVar65,auVar49);
        auVar60 = vunpcklps_avx(auVar67,auVar39);
        auVar49 = vunpckhps_avx(auVar67,auVar39);
        auVar62 = *(undefined1 (*) [16])(lVar23 + uVar24 * 4);
        auVar39 = vunpcklps_avx(auVar51,auVar49);
        auVar65 = vunpcklps_avx(auVar42,auVar60);
        auVar51 = vunpckhps_avx(auVar42,auVar60);
        auVar49 = vunpcklps_avx(auVar41,auVar58);
        auVar58 = vunpckhps_avx(auVar41,auVar58);
        auVar42 = vunpcklps_avx(auVar47,auVar62);
        auVar62 = vunpckhps_avx(auVar47,auVar62);
        auVar47 = *(undefined1 (*) [16])(lVar23 + uVar33 * 4);
        auVar41 = vunpcklps_avx(auVar58,auVar62);
        auVar60 = vunpcklps_avx(auVar49,auVar42);
        auVar62 = vunpckhps_avx(auVar49,auVar42);
        auVar42 = vunpcklps_avx(auVar50,auVar47);
        auVar49 = vunpckhps_avx(auVar50,auVar47);
        auVar47 = *(undefined1 (*) [16])(lVar23 + uVar29 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar23 + uVar32 * 4);
        auVar50 = vunpcklps_avx(auVar47,auVar58);
        auVar47 = vunpckhps_avx(auVar47,auVar58);
        auVar67 = vunpcklps_avx(auVar49,auVar47);
        auVar66 = vunpcklps_avx(auVar42,auVar50);
        auVar49 = vunpckhps_avx(auVar42,auVar50);
        auVar47 = *(undefined1 (*) [16])(lVar23 + uVar28 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar23 + uVar31 * 4);
        auVar50 = vunpcklps_avx(auVar47,auVar58);
        auVar42 = vunpckhps_avx(auVar47,auVar58);
        auVar47 = *(undefined1 (*) [16])(lVar23 + uVar30 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar23 + uVar19 * 4);
        auVar68 = vunpcklps_avx(auVar47,auVar58);
        auVar47 = vunpckhps_avx(auVar47,auVar58);
        auVar58 = vunpcklps_avx(auVar42,auVar47);
        auVar42 = vunpcklps_avx(auVar50,auVar68);
        auVar47 = vunpckhps_avx(auVar50,auVar68);
        fVar105 = 1.0 - fVar99;
        auVar123._4_4_ = fVar105;
        auVar123._0_4_ = fVar105;
        auVar123._8_4_ = fVar105;
        auVar123._12_4_ = fVar105;
        auVar78._0_4_ = fVar99 * auVar60._0_4_;
        auVar78._4_4_ = fVar99 * auVar60._4_4_;
        auVar78._8_4_ = fVar99 * auVar60._8_4_;
        auVar78._12_4_ = fVar99 * auVar60._12_4_;
        auVar50 = vfmadd231ps_fma(auVar78,auVar123,auVar64);
        auVar100._0_4_ = fVar99 * auVar62._0_4_;
        auVar100._4_4_ = fVar99 * auVar62._4_4_;
        auVar100._8_4_ = fVar99 * auVar62._8_4_;
        auVar100._12_4_ = fVar99 * auVar62._12_4_;
        auVar62 = vfmadd231ps_fma(auVar100,auVar123,auVar73);
        auVar88._0_4_ = fVar99 * auVar41._0_4_;
        auVar88._4_4_ = fVar99 * auVar41._4_4_;
        auVar88._8_4_ = fVar99 * auVar41._8_4_;
        auVar88._12_4_ = fVar99 * auVar41._12_4_;
        auVar73 = vfmadd231ps_fma(auVar88,auVar123,auVar63);
        auVar74._0_4_ = fVar99 * auVar66._0_4_;
        auVar74._4_4_ = fVar99 * auVar66._4_4_;
        auVar74._8_4_ = fVar99 * auVar66._8_4_;
        auVar74._12_4_ = fVar99 * auVar66._12_4_;
        auVar41 = vfmadd231ps_fma(auVar74,auVar123,auVar59);
        auVar66._0_4_ = fVar99 * auVar49._0_4_;
        auVar66._4_4_ = fVar99 * auVar49._4_4_;
        auVar66._8_4_ = fVar99 * auVar49._8_4_;
        auVar66._12_4_ = fVar99 * auVar49._12_4_;
        auVar48 = vfmadd231ps_fma(auVar66,auVar123,auVar48);
        puVar1 = (undefined8 *)(local_2800 + 0x30 + lVar20);
        local_2560 = *puVar1;
        uStack_2558 = puVar1[1];
        puVar1 = (undefined8 *)(local_2800 + 0x40 + lVar20);
        auVar49._0_4_ = fVar99 * auVar67._0_4_;
        auVar49._4_4_ = fVar99 * auVar67._4_4_;
        auVar49._8_4_ = fVar99 * auVar67._8_4_;
        auVar49._12_4_ = fVar99 * auVar67._12_4_;
        auVar49 = vfmadd231ps_fma(auVar49,auVar123,auVar40);
        auVar59._0_4_ = fVar99 * auVar42._0_4_;
        auVar59._4_4_ = fVar99 * auVar42._4_4_;
        auVar59._8_4_ = fVar99 * auVar42._8_4_;
        auVar59._12_4_ = fVar99 * auVar42._12_4_;
        auVar63._0_4_ = fVar99 * auVar47._0_4_;
        auVar63._4_4_ = fVar99 * auVar47._4_4_;
        auVar63._8_4_ = fVar99 * auVar47._8_4_;
        auVar63._12_4_ = fVar99 * auVar47._12_4_;
        auVar112._0_4_ = fVar99 * auVar58._0_4_;
        auVar112._4_4_ = fVar99 * auVar58._4_4_;
        auVar112._8_4_ = fVar99 * auVar58._8_4_;
        auVar112._12_4_ = fVar99 * auVar58._12_4_;
        auVar42 = vfmadd231ps_fma(auVar59,auVar123,auVar65);
        auVar51 = vfmadd231ps_fma(auVar63,auVar123,auVar51);
        auVar40 = vfmadd231ps_fma(auVar112,auVar123,auVar39);
        local_26b0 = *puVar1;
        uStack_26a8 = puVar1[1];
        local_2670 = &local_2801;
        uVar18 = *(undefined4 *)(local_26f8 + local_2700 * 4);
        auVar39._4_4_ = uVar18;
        auVar39._0_4_ = uVar18;
        auVar39._8_4_ = uVar18;
        auVar39._12_4_ = uVar18;
        uVar18 = *(undefined4 *)(local_26f8 + local_2700 * 4 + 0x10);
        auVar131._4_4_ = uVar18;
        auVar131._0_4_ = uVar18;
        auVar131._8_4_ = uVar18;
        auVar131._12_4_ = uVar18;
        uVar18 = *(undefined4 *)(local_26f8 + local_2700 * 4 + 0x20);
        auVar140._4_4_ = uVar18;
        auVar140._0_4_ = uVar18;
        auVar140._8_4_ = uVar18;
        auVar140._12_4_ = uVar18;
        local_27b0 = vsubps_avx(auVar50,auVar39);
        local_27c0 = vsubps_avx(auVar62,auVar131);
        local_2750 = vsubps_avx(auVar73,auVar140);
        auVar47 = vsubps_avx(auVar41,auVar39);
        auVar58 = vsubps_avx(auVar48,auVar131);
        auVar62 = vsubps_avx(auVar49,auVar140);
        auVar48 = vsubps_avx(auVar42,auVar39);
        auVar73 = vsubps_avx(auVar51,auVar131);
        auVar51 = vsubps_avx(auVar40,auVar140);
        local_2760 = vsubps_avx(auVar48,local_27b0);
        local_2570 = vsubps_avx(auVar73,local_27c0);
        local_2770 = vsubps_avx(auVar51,local_2750);
        auVar40._0_4_ = auVar48._0_4_ + local_27b0._0_4_;
        auVar40._4_4_ = auVar48._4_4_ + local_27b0._4_4_;
        auVar40._8_4_ = auVar48._8_4_ + local_27b0._8_4_;
        auVar40._12_4_ = auVar48._12_4_ + local_27b0._12_4_;
        auVar64._0_4_ = auVar73._0_4_ + local_27c0._0_4_;
        auVar64._4_4_ = auVar73._4_4_ + local_27c0._4_4_;
        auVar64._8_4_ = auVar73._8_4_ + local_27c0._8_4_;
        auVar64._12_4_ = auVar73._12_4_ + local_27c0._12_4_;
        fVar105 = local_2750._0_4_;
        auVar67._0_4_ = auVar51._0_4_ + fVar105;
        fVar106 = local_2750._4_4_;
        auVar67._4_4_ = auVar51._4_4_ + fVar106;
        fVar107 = local_2750._8_4_;
        auVar67._8_4_ = auVar51._8_4_ + fVar107;
        fVar108 = local_2750._12_4_;
        auVar67._12_4_ = auVar51._12_4_ + fVar108;
        auVar132._0_4_ = local_2770._0_4_ * auVar64._0_4_;
        auVar132._4_4_ = local_2770._4_4_ * auVar64._4_4_;
        auVar132._8_4_ = local_2770._8_4_ * auVar64._8_4_;
        auVar132._12_4_ = local_2770._12_4_ * auVar64._12_4_;
        auVar42 = vfmsub231ps_fma(auVar132,local_2570,auVar67);
        auVar68._0_4_ = local_2760._0_4_ * auVar67._0_4_;
        auVar68._4_4_ = local_2760._4_4_ * auVar67._4_4_;
        auVar68._8_4_ = local_2760._8_4_ * auVar67._8_4_;
        auVar68._12_4_ = local_2760._12_4_ * auVar67._12_4_;
        auVar49 = vfmsub231ps_fma(auVar68,local_2770,auVar40);
        auVar41._0_4_ = local_2570._0_4_ * auVar40._0_4_;
        auVar41._4_4_ = local_2570._4_4_ * auVar40._4_4_;
        auVar41._8_4_ = local_2570._8_4_ * auVar40._8_4_;
        auVar41._12_4_ = local_2570._12_4_ * auVar40._12_4_;
        auVar40 = vfmsub231ps_fma(auVar41,local_2760,auVar64);
        fVar99 = *(float *)(local_26f8 + local_2700 * 4 + 0x60);
        auVar60._0_4_ = fVar99 * auVar40._0_4_;
        auVar60._4_4_ = fVar99 * auVar40._4_4_;
        auVar60._8_4_ = fVar99 * auVar40._8_4_;
        auVar60._12_4_ = fVar99 * auVar40._12_4_;
        uVar18 = *(undefined4 *)(local_26f8 + local_2700 * 4 + 0x50);
        auVar101._4_4_ = uVar18;
        auVar101._0_4_ = uVar18;
        auVar101._8_4_ = uVar18;
        auVar101._12_4_ = uVar18;
        auVar49 = vfmadd231ps_fma(auVar60,auVar101,auVar49);
        uVar18 = *(undefined4 *)(local_26f8 + local_2700 * 4 + 0x40);
        local_27d0._4_4_ = uVar18;
        local_27d0._0_4_ = uVar18;
        local_27d0._8_4_ = uVar18;
        local_27d0._12_4_ = uVar18;
        local_25b0 = vfmadd231ps_fma(auVar49,local_27d0,auVar42);
        local_2580 = vsubps_avx(local_27c0,auVar58);
        local_25a0 = vsubps_avx(local_2750,auVar62);
        auVar65._0_4_ = local_27c0._0_4_ + auVar58._0_4_;
        auVar65._4_4_ = local_27c0._4_4_ + auVar58._4_4_;
        auVar65._8_4_ = local_27c0._8_4_ + auVar58._8_4_;
        auVar65._12_4_ = local_27c0._12_4_ + auVar58._12_4_;
        auVar69._0_4_ = auVar62._0_4_ + fVar105;
        auVar69._4_4_ = auVar62._4_4_ + fVar106;
        auVar69._8_4_ = auVar62._8_4_ + fVar107;
        auVar69._12_4_ = auVar62._12_4_ + fVar108;
        fVar109 = local_25a0._0_4_;
        auVar79._0_4_ = auVar65._0_4_ * fVar109;
        fVar111 = local_25a0._4_4_;
        auVar79._4_4_ = auVar65._4_4_ * fVar111;
        fVar114 = local_25a0._8_4_;
        auVar79._8_4_ = auVar65._8_4_ * fVar114;
        fVar116 = local_25a0._12_4_;
        auVar79._12_4_ = auVar65._12_4_ * fVar116;
        auVar42 = vfmsub231ps_fma(auVar79,local_2580,auVar69);
        local_2590 = vsubps_avx(local_27b0,auVar47);
        fVar147 = local_2590._0_4_;
        auVar89._0_4_ = fVar147 * auVar69._0_4_;
        fVar150 = local_2590._4_4_;
        auVar89._4_4_ = fVar150 * auVar69._4_4_;
        fVar151 = local_2590._8_4_;
        auVar89._8_4_ = fVar151 * auVar69._8_4_;
        fVar152 = local_2590._12_4_;
        auVar89._12_4_ = fVar152 * auVar69._12_4_;
        auVar70._0_4_ = local_27b0._0_4_ + auVar47._0_4_;
        auVar70._4_4_ = local_27b0._4_4_ + auVar47._4_4_;
        auVar70._8_4_ = local_27b0._8_4_ + auVar47._8_4_;
        auVar70._12_4_ = local_27b0._12_4_ + auVar47._12_4_;
        auVar49 = vfmsub231ps_fma(auVar89,local_25a0,auVar70);
        fVar110 = local_2580._0_4_;
        auVar71._0_4_ = auVar70._0_4_ * fVar110;
        fVar113 = local_2580._4_4_;
        auVar71._4_4_ = auVar70._4_4_ * fVar113;
        fVar115 = local_2580._8_4_;
        auVar71._8_4_ = auVar70._8_4_ * fVar115;
        fVar117 = local_2580._12_4_;
        auVar71._12_4_ = auVar70._12_4_ * fVar117;
        auVar40 = vfmsub231ps_fma(auVar71,local_2590,auVar65);
        auVar72._0_4_ = fVar99 * auVar40._0_4_;
        auVar72._4_4_ = fVar99 * auVar40._4_4_;
        auVar72._8_4_ = fVar99 * auVar40._8_4_;
        auVar72._12_4_ = fVar99 * auVar40._12_4_;
        auVar49 = vfmadd231ps_fma(auVar72,auVar101,auVar49);
        local_26a0._16_16_ = vfmadd231ps_fma(auVar49,local_27d0,auVar42);
        auVar49 = vsubps_avx(auVar47,auVar48);
        auVar80._0_4_ = auVar48._0_4_ + auVar47._0_4_;
        auVar80._4_4_ = auVar48._4_4_ + auVar47._4_4_;
        auVar80._8_4_ = auVar48._8_4_ + auVar47._8_4_;
        auVar80._12_4_ = auVar48._12_4_ + auVar47._12_4_;
        auVar48 = vsubps_avx(auVar58,auVar73);
        auVar42._0_4_ = auVar58._0_4_ + auVar73._0_4_;
        auVar42._4_4_ = auVar58._4_4_ + auVar73._4_4_;
        auVar42._8_4_ = auVar58._8_4_ + auVar73._8_4_;
        auVar42._12_4_ = auVar58._12_4_ + auVar73._12_4_;
        auVar73 = vsubps_avx(auVar62,auVar51);
        auVar50._0_4_ = auVar62._0_4_ + auVar51._0_4_;
        auVar50._4_4_ = auVar62._4_4_ + auVar51._4_4_;
        auVar50._8_4_ = auVar62._8_4_ + auVar51._8_4_;
        auVar50._12_4_ = auVar62._12_4_ + auVar51._12_4_;
        auVar90._0_4_ = auVar42._0_4_ * auVar73._0_4_;
        auVar90._4_4_ = auVar42._4_4_ * auVar73._4_4_;
        auVar90._8_4_ = auVar42._8_4_ * auVar73._8_4_;
        auVar90._12_4_ = auVar42._12_4_ * auVar73._12_4_;
        auVar58 = vfmsub231ps_fma(auVar90,auVar48,auVar50);
        auVar51._0_4_ = auVar50._0_4_ * auVar49._0_4_;
        auVar51._4_4_ = auVar50._4_4_ * auVar49._4_4_;
        auVar51._8_4_ = auVar50._8_4_ * auVar49._8_4_;
        auVar51._12_4_ = auVar50._12_4_ * auVar49._12_4_;
        auVar47 = vfmsub231ps_fma(auVar51,auVar73,auVar80);
        auVar81._0_4_ = auVar48._0_4_ * auVar80._0_4_;
        auVar81._4_4_ = auVar48._4_4_ * auVar80._4_4_;
        auVar81._8_4_ = auVar48._8_4_ * auVar80._8_4_;
        auVar81._12_4_ = auVar48._12_4_ * auVar80._12_4_;
        auVar62 = vfmsub231ps_fma(auVar81,auVar49,auVar42);
        auVar82._0_4_ = fVar99 * auVar62._0_4_;
        auVar82._4_4_ = fVar99 * auVar62._4_4_;
        auVar82._8_4_ = fVar99 * auVar62._8_4_;
        auVar82._12_4_ = fVar99 * auVar62._12_4_;
        auVar47 = vfmadd231ps_fma(auVar82,auVar101,auVar47);
        auVar62 = vfmadd231ps_fma(auVar47,local_27d0,auVar58);
        local_2680._0_4_ = auVar62._0_4_ + local_25b0._0_4_ + local_26a0._16_4_;
        local_2680._4_4_ = auVar62._4_4_ + local_25b0._4_4_ + local_26a0._20_4_;
        local_2680._8_4_ = auVar62._8_4_ + local_25b0._8_4_ + local_26a0._24_4_;
        local_2680._12_4_ = auVar62._12_4_ + local_25b0._12_4_ + local_26a0._28_4_;
        auVar148._8_4_ = 0x7fffffff;
        auVar148._0_8_ = 0x7fffffff7fffffff;
        auVar148._12_4_ = 0x7fffffff;
        auVar47 = vminps_avx(local_25b0,local_26a0._16_16_);
        auVar47 = vminps_avx(auVar47,auVar62);
        local_25c0 = vandps_avx(local_2680,auVar148);
        auVar102._0_4_ = local_25c0._0_4_ * 1.1920929e-07;
        auVar102._4_4_ = local_25c0._4_4_ * 1.1920929e-07;
        auVar102._8_4_ = local_25c0._8_4_ * 1.1920929e-07;
        auVar102._12_4_ = local_25c0._12_4_ * 1.1920929e-07;
        uVar21 = CONCAT44(auVar102._4_4_,auVar102._0_4_);
        auVar91._0_8_ = uVar21 ^ 0x8000000080000000;
        auVar91._8_4_ = -auVar102._8_4_;
        auVar91._12_4_ = -auVar102._12_4_;
        auVar47 = vcmpps_avx(auVar47,auVar91,5);
        auVar58 = vmaxps_avx(local_25b0,local_26a0._16_16_);
        auVar58 = vmaxps_avx(auVar58,auVar62);
        auVar58 = vcmpps_avx(auVar58,auVar102,2);
        local_27a0 = vorps_avx(auVar47,auVar58);
        uVar27 = local_2800;
        if ((((local_27a0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_27a0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_27a0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_27a0[0xf] < '\0') {
          auVar52._0_4_ = fVar110 * local_2770._0_4_;
          auVar52._4_4_ = fVar113 * local_2770._4_4_;
          auVar52._8_4_ = fVar115 * local_2770._8_4_;
          auVar52._12_4_ = fVar117 * local_2770._12_4_;
          auVar83._0_4_ = fVar147 * local_2570._0_4_;
          auVar83._4_4_ = fVar150 * local_2570._4_4_;
          auVar83._8_4_ = fVar151 * local_2570._8_4_;
          auVar83._12_4_ = fVar152 * local_2570._12_4_;
          auVar62 = vfmsub213ps_fma(local_2570,local_25a0,auVar52);
          auVar92._0_4_ = auVar48._0_4_ * fVar109;
          auVar92._4_4_ = auVar48._4_4_ * fVar111;
          auVar92._8_4_ = auVar48._8_4_ * fVar114;
          auVar92._12_4_ = auVar48._12_4_ * fVar116;
          auVar103._0_4_ = fVar147 * auVar73._0_4_;
          auVar103._4_4_ = fVar150 * auVar73._4_4_;
          auVar103._8_4_ = fVar151 * auVar73._8_4_;
          auVar103._12_4_ = fVar152 * auVar73._12_4_;
          auVar73 = vfmsub213ps_fma(auVar73,local_2580,auVar92);
          auVar47 = vandps_avx(auVar148,auVar52);
          auVar58 = vandps_avx(auVar148,auVar92);
          auVar47 = vcmpps_avx(auVar47,auVar58,1);
          local_2620 = vblendvps_avx(auVar73,auVar62,auVar47);
          auVar75._0_4_ = fVar110 * auVar49._0_4_;
          auVar75._4_4_ = fVar113 * auVar49._4_4_;
          auVar75._8_4_ = fVar115 * auVar49._8_4_;
          auVar75._12_4_ = fVar117 * auVar49._12_4_;
          auVar62 = vfmsub213ps_fma(auVar49,local_25a0,auVar103);
          auVar93._0_4_ = local_2760._0_4_ * fVar109;
          auVar93._4_4_ = local_2760._4_4_ * fVar111;
          auVar93._8_4_ = local_2760._8_4_ * fVar114;
          auVar93._12_4_ = local_2760._12_4_ * fVar116;
          auVar73 = vfmsub213ps_fma(local_2770,local_2590,auVar93);
          auVar47 = vandps_avx(auVar148,auVar93);
          auVar58 = vandps_avx(auVar103,auVar148);
          auVar47 = vcmpps_avx(auVar47,auVar58,1);
          local_2610 = vblendvps_avx(auVar62,auVar73,auVar47);
          auVar62 = vfmsub213ps_fma(local_2760,local_2580,auVar83);
          auVar48 = vfmsub213ps_fma(auVar48,local_2590,auVar75);
          auVar47 = vandps_avx(auVar148,auVar83);
          auVar58 = vandps_avx(auVar148,auVar75);
          auVar47 = vcmpps_avx(auVar47,auVar58,1);
          local_2600[0] = vblendvps_avx(auVar48,auVar62,auVar47);
          auVar76._0_4_ = local_2600[0]._0_4_ * fVar99;
          auVar76._4_4_ = local_2600[0]._4_4_ * fVar99;
          auVar76._8_4_ = local_2600[0]._8_4_ * fVar99;
          auVar76._12_4_ = local_2600[0]._12_4_ * fVar99;
          auVar47 = vfmadd213ps_fma(auVar101,local_2610,auVar76);
          auVar47 = vfmadd213ps_fma(local_27d0,local_2620,auVar47);
          auVar77._0_4_ = auVar47._0_4_ + auVar47._0_4_;
          auVar77._4_4_ = auVar47._4_4_ + auVar47._4_4_;
          auVar77._8_4_ = auVar47._8_4_ + auVar47._8_4_;
          auVar77._12_4_ = auVar47._12_4_ + auVar47._12_4_;
          auVar84._0_4_ = local_2600[0]._0_4_ * fVar105;
          auVar84._4_4_ = local_2600[0]._4_4_ * fVar106;
          auVar84._8_4_ = local_2600[0]._8_4_ * fVar107;
          auVar84._12_4_ = local_2600[0]._12_4_ * fVar108;
          auVar47 = vfmadd213ps_fma(local_27c0,local_2610,auVar84);
          auVar58 = vfmadd213ps_fma(local_27b0,local_2620,auVar47);
          auVar47 = vrcpps_avx(auVar77);
          auVar104._8_4_ = 0x3f800000;
          auVar104._0_8_ = &DAT_3f8000003f800000;
          auVar104._12_4_ = 0x3f800000;
          auVar62 = vfnmadd213ps_fma(auVar47,auVar77,auVar104);
          auVar47 = vfmadd132ps_fma(auVar62,auVar47,auVar47);
          local_2630._0_4_ = auVar47._0_4_ * (auVar58._0_4_ + auVar58._0_4_);
          local_2630._4_4_ = auVar47._4_4_ * (auVar58._4_4_ + auVar58._4_4_);
          local_2630._8_4_ = auVar47._8_4_ * (auVar58._8_4_ + auVar58._8_4_);
          local_2630._12_4_ = auVar47._12_4_ * (auVar58._12_4_ + auVar58._12_4_);
          auVar46 = ZEXT1664(local_2630);
          uVar18 = *(undefined4 *)(local_26f8 + local_2700 * 4 + 0x30);
          auVar85._4_4_ = uVar18;
          auVar85._0_4_ = uVar18;
          auVar85._8_4_ = uVar18;
          auVar85._12_4_ = uVar18;
          auVar47 = vcmpps_avx(auVar85,local_2630,2);
          uVar18 = *(undefined4 *)(local_26f8 + local_2700 * 4 + 0x80);
          auVar94._4_4_ = uVar18;
          auVar94._0_4_ = uVar18;
          auVar94._8_4_ = uVar18;
          auVar94._12_4_ = uVar18;
          auVar58 = vcmpps_avx(local_2630,auVar94,2);
          auVar47 = vandps_avx(auVar47,auVar58);
          auVar62 = local_27a0 & auVar47;
          if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar62[0xf] < '\0') {
            auVar47 = vandps_avx(auVar47,local_27a0);
            auVar62 = vcmpps_avx(auVar77,_DAT_01feba10,4);
            auVar48 = auVar62 & auVar47;
            if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar48[0xf] < '\0') {
              local_2790 = vandps_avx(auVar47,auVar62);
              local_26a0._0_16_ = local_25b0;
              pRVar22 = &local_2801;
              local_2670 = pRVar22;
              local_2660 = local_2790;
              auVar47 = vrcpps_avx(local_2680);
              auVar61._8_4_ = 0x3f800000;
              auVar61._0_8_ = &DAT_3f8000003f800000;
              auVar61._12_4_ = 0x3f800000;
              auVar62 = vfnmadd213ps_fma(local_2680,auVar47,auVar61);
              auVar62 = vfmadd132ps_fma(auVar62,auVar47,auVar47);
              auVar53._8_4_ = 0x219392ef;
              auVar53._0_8_ = 0x219392ef219392ef;
              auVar53._12_4_ = 0x219392ef;
              auVar47 = vcmpps_avx(local_25c0,auVar53,5);
              auVar47 = vandps_avx(auVar62,auVar47);
              auVar43._0_4_ = local_25b0._0_4_ * auVar47._0_4_;
              auVar43._4_4_ = local_25b0._4_4_ * auVar47._4_4_;
              auVar43._8_4_ = local_25b0._8_4_ * auVar47._8_4_;
              auVar43._12_4_ = local_25b0._12_4_ * auVar47._12_4_;
              local_2650 = vminps_avx(auVar43,auVar61);
              auVar44._0_4_ = auVar47._0_4_ * local_26a0._16_4_;
              auVar44._4_4_ = auVar47._4_4_ * local_26a0._20_4_;
              auVar44._8_4_ = auVar47._8_4_ * local_26a0._24_4_;
              auVar44._12_4_ = auVar47._12_4_ * local_26a0._28_4_;
              local_2640 = vminps_avx(auVar44,auVar61);
              auVar54._8_4_ = 0x7f800000;
              auVar54._0_8_ = 0x7f8000007f800000;
              auVar54._12_4_ = 0x7f800000;
              auVar47 = vblendvps_avx(auVar54,local_2630,local_2790);
              auVar62 = vshufps_avx(auVar47,auVar47,0xb1);
              auVar62 = vminps_avx(auVar62,auVar47);
              auVar48 = vshufpd_avx(auVar62,auVar62,1);
              auVar62 = vminps_avx(auVar48,auVar62);
              auVar62 = vcmpps_avx(auVar47,auVar62,0);
              auVar48 = local_2790 & auVar62;
              auVar47 = vpcmpeqd_avx(auVar47,auVar47);
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                auVar47 = auVar62;
              }
              auVar47 = vandps_avx(local_2790,auVar47);
              auVar58 = vpcmpeqd_avx(auVar58,auVar58);
              auVar87 = ZEXT1664(auVar58);
              local_2778 = pSVar34;
              do {
                auVar47 = vpslld_avx(auVar47,0x1f);
                uVar18 = vmovmskps_avx(auVar47);
                lVar9 = 0;
                for (uVar21 = CONCAT44((int)((ulong)pRVar22 >> 0x20),uVar18); (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  lVar9 = lVar9 + 1;
                }
                local_24f0 = *(uint *)((long)&local_2560 + lVar9 * 4);
                pRVar22 = (RayHitK<4> *)(ulong)local_24f0;
                pGVar5 = (pSVar34->geometries).items[(long)pRVar22].ptr;
                if ((pGVar5->mask & *(uint *)(ray + sVar37 * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2790 + lVar9 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar21 = (ulong)(uint)((int)lVar9 << 2);
                    uVar18 = *(undefined4 *)(local_2650 + uVar21);
                    uVar2 = *(undefined4 *)(local_2640 + uVar21);
                    *(undefined4 *)(ray + sVar37 * 4 + 0x80) = *(undefined4 *)(local_2630 + uVar21);
                    *(undefined4 *)(ray + sVar37 * 4 + 0xc0) = *(undefined4 *)(local_2620 + uVar21);
                    *(undefined4 *)(ray + sVar37 * 4 + 0xd0) = *(undefined4 *)(local_2610 + uVar21);
                    *(undefined4 *)(ray + sVar37 * 4 + 0xe0) =
                         *(undefined4 *)(local_2600[0] + uVar21);
                    *(undefined4 *)(ray + sVar37 * 4 + 0xf0) = uVar18;
                    *(undefined4 *)(ray + sVar37 * 4 + 0x100) = uVar2;
                    *(undefined4 *)(ray + sVar37 * 4 + 0x110) =
                         *(undefined4 *)((long)&local_26b0 + uVar21);
                    *(uint *)(ray + sVar37 * 4 + 0x120) = local_24f0;
                    *(uint *)(ray + sVar37 * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + sVar37 * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  uVar21 = (ulong)(uint)((int)lVar9 * 4);
                  uVar18 = *(undefined4 *)(local_2650 + uVar21);
                  local_2520._4_4_ = uVar18;
                  local_2520._0_4_ = uVar18;
                  local_2520._8_4_ = uVar18;
                  local_2520._12_4_ = uVar18;
                  local_2510 = *(undefined4 *)(local_2640 + uVar21);
                  local_2500 = *(undefined4 *)((long)&local_26b0 + uVar21);
                  uVar18 = *(undefined4 *)(local_2620 + uVar21);
                  local_2550._4_4_ = uVar18;
                  local_2550._0_4_ = uVar18;
                  local_2550._8_4_ = uVar18;
                  local_2550._12_4_ = uVar18;
                  uVar18 = *(undefined4 *)(local_2610 + uVar21);
                  local_2540._4_4_ = uVar18;
                  local_2540._0_4_ = uVar18;
                  local_2540._8_4_ = uVar18;
                  local_2540._12_4_ = uVar18;
                  uVar18 = *(undefined4 *)(local_2600[0] + uVar21);
                  local_2530._4_4_ = uVar18;
                  local_2530._0_4_ = uVar18;
                  local_2530._8_4_ = uVar18;
                  local_2530._12_4_ = uVar18;
                  uStack_250c = local_2510;
                  uStack_2508 = local_2510;
                  uStack_2504 = local_2510;
                  uStack_24fc = local_2500;
                  uStack_24f8 = local_2500;
                  uStack_24f4 = local_2500;
                  uStack_24ec = local_24f0;
                  uStack_24e8 = local_24f0;
                  uStack_24e4 = local_24f0;
                  vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                  uStack_24dc = context->user->instID[0];
                  local_24e0 = uStack_24dc;
                  uStack_24d8 = uStack_24dc;
                  uStack_24d4 = uStack_24dc;
                  uStack_24d0 = context->user->instPrimID[0];
                  uStack_24cc = uStack_24d0;
                  uStack_24c8 = uStack_24d0;
                  uStack_24c4 = uStack_24d0;
                  local_27d0._0_4_ = *(undefined4 *)(ray + sVar37 * 4 + 0x80);
                  *(undefined4 *)(ray + sVar37 * 4 + 0x80) = *(undefined4 *)(local_2630 + uVar21);
                  local_2740 = *local_2730;
                  uStack_2738 = local_2730[1];
                  local_26e0 = &local_2740;
                  local_26d8 = pGVar5->userPtr;
                  local_26d0 = context->user;
                  local_26c8 = ray;
                  local_26c0 = &local_2550;
                  local_26b8 = 4;
                  pRVar22 = (RayHitK<4> *)pGVar5->intersectionFilterN;
                  local_27e0 = auVar46._0_16_;
                  if (pRVar22 != (RayHitK<4> *)0x0) {
                    auVar47 = auVar87._0_16_;
                    pRVar22 = (RayHitK<4> *)(*(code *)pRVar22)(&local_26e0);
                    auVar46 = ZEXT1664(local_27e0);
                    auVar47 = vpcmpeqd_avx(auVar47,auVar47);
                    auVar87 = ZEXT1664(auVar47);
                    uVar27 = local_2800;
                    pSVar34 = local_2778;
                  }
                  auVar14._8_8_ = uStack_2738;
                  auVar14._0_8_ = local_2740;
                  auVar47 = auVar87._0_16_;
                  if (auVar14 == (undefined1  [16])0x0) {
                    auVar58 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar58 = auVar58 ^ auVar47;
                  }
                  else {
                    pRVar22 = (RayHitK<4> *)context->args->filter;
                    if ((pRVar22 != (RayHitK<4> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar22 = (RayHitK<4> *)(*(code *)pRVar22)(&local_26e0);
                      auVar46 = ZEXT1664(local_27e0);
                      auVar47 = vpcmpeqd_avx(auVar47,auVar47);
                      auVar87 = ZEXT1664(auVar47);
                      uVar27 = local_2800;
                    }
                    auVar15._8_8_ = uStack_2738;
                    auVar15._0_8_ = local_2740;
                    auVar47 = vpcmpeqd_avx(auVar15,_DAT_01feba10);
                    auVar58 = auVar47 ^ auVar87._0_16_;
                    if (auVar15 != (undefined1  [16])0x0) {
                      auVar47 = auVar47 ^ auVar87._0_16_;
                      auVar62 = vmaskmovps_avx(auVar47,*local_26c0);
                      *(undefined1 (*) [16])(local_26c8 + 0xc0) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar47,local_26c0[1]);
                      *(undefined1 (*) [16])(local_26c8 + 0xd0) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar47,local_26c0[2]);
                      *(undefined1 (*) [16])(local_26c8 + 0xe0) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar47,local_26c0[3]);
                      *(undefined1 (*) [16])(local_26c8 + 0xf0) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar47,local_26c0[4]);
                      *(undefined1 (*) [16])(local_26c8 + 0x100) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar47,local_26c0[5]);
                      *(undefined1 (*) [16])(local_26c8 + 0x110) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar47,local_26c0[6]);
                      *(undefined1 (*) [16])(local_26c8 + 0x120) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar47,local_26c0[7]);
                      *(undefined1 (*) [16])(local_26c8 + 0x130) = auVar62;
                      auVar47 = vmaskmovps_avx(auVar47,local_26c0[8]);
                      *(undefined1 (*) [16])(local_26c8 + 0x140) = auVar47;
                      pRVar22 = local_26c8;
                    }
                  }
                  auVar56._8_8_ = 0x100000001;
                  auVar56._0_8_ = 0x100000001;
                  if ((auVar56 & auVar58) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + sVar37 * 4 + 0x80) = local_27d0._0_4_;
                  }
                  *(undefined4 *)(local_2790 + lVar9 * 4) = 0;
                  uVar18 = *(undefined4 *)(ray + sVar37 * 4 + 0x80);
                  auVar45._4_4_ = uVar18;
                  auVar45._0_4_ = uVar18;
                  auVar45._8_4_ = uVar18;
                  auVar45._12_4_ = uVar18;
                  auVar47 = vcmpps_avx(auVar46._0_16_,auVar45,2);
                  local_2790 = vandps_avx(auVar47,local_2790);
                }
                if ((((local_2790 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2790 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2790 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2790[0xf]) break;
                auVar55._8_4_ = 0x7f800000;
                auVar55._0_8_ = 0x7f8000007f800000;
                auVar55._12_4_ = 0x7f800000;
                auVar47 = vblendvps_avx(auVar55,auVar46._0_16_,local_2790);
                auVar58 = vshufps_avx(auVar47,auVar47,0xb1);
                auVar58 = vminps_avx(auVar58,auVar47);
                auVar62 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar62,auVar58);
                auVar58 = vcmpps_avx(auVar47,auVar58,0);
                auVar62 = local_2790 & auVar58;
                auVar47 = local_2790;
                if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar62[0xf] < '\0') {
                  auVar47 = vandps_avx(auVar58,local_2790);
                }
                auVar47 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar47);
              } while( true );
            }
          }
        }
        local_26e8 = local_26e8 + 1;
        pRVar22 = ray;
        sVar35 = sVar37;
      } while (local_26e8 != local_26f0);
    }
    uVar18 = *(undefined4 *)(ray + sVar37 * 4 + 0x80);
    auVar46 = ZEXT3264(CONCAT428(uVar18,CONCAT424(uVar18,CONCAT420(uVar18,CONCAT416(uVar18,CONCAT412
                                                  (uVar18,CONCAT48(uVar18,CONCAT44(uVar18,uVar18))))
                                                  ))));
    auVar87 = ZEXT3264(local_23c0);
    auVar96 = ZEXT3264(local_23e0);
    auVar98 = ZEXT3264(local_2400);
    auVar149 = ZEXT3264(local_25e0);
    k = local_2708;
    uVar21 = local_27e8;
    uVar24 = local_27f0;
    uVar28 = local_2710;
    uVar29 = local_2718;
    uVar30 = local_2728;
    uVar31 = local_2720;
    fVar99 = local_2420;
    fVar105 = fStack_241c;
    fVar106 = fStack_2418;
    fVar107 = fStack_2414;
    fVar108 = fStack_2410;
    fVar109 = fStack_240c;
    fVar110 = fStack_2408;
    fVar111 = local_2440;
    fVar113 = fStack_243c;
    fVar114 = fStack_2438;
    fVar115 = fStack_2434;
    fVar116 = fStack_2430;
    fVar117 = fStack_242c;
    fVar147 = fStack_2428;
    fVar150 = local_2460;
    fVar151 = fStack_245c;
    fVar152 = fStack_2458;
    fVar118 = fStack_2454;
    fVar119 = fStack_2450;
    fVar120 = fStack_244c;
    fVar121 = fStack_2448;
    fVar122 = local_2480;
    fVar124 = fStack_247c;
    fVar125 = fStack_2478;
    fVar126 = fStack_2474;
    fVar127 = fStack_2470;
    fVar128 = fStack_246c;
    fVar129 = fStack_2468;
    fVar130 = local_24a0;
    fVar133 = fStack_249c;
    fVar134 = fStack_2498;
    fVar135 = fStack_2494;
    fVar136 = fStack_2490;
    fVar137 = fStack_248c;
    fVar138 = fStack_2488;
    fVar139 = local_24c0;
    fVar141 = fStack_24bc;
    fVar142 = fStack_24b8;
    fVar143 = fStack_24b4;
    fVar144 = fStack_24b0;
    fVar145 = fStack_24ac;
    fVar146 = fStack_24a8;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }